

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunHighs.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  HighsLogOptions *report_log_options;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  allocator local_5bd9;
  string usage_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5bb8 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b58;
  string local_5b38;
  string local_5b18;
  string local_5af8 [32];
  HighsCommandLineOptions cmd_options;
  App app;
  HighsOptions loaded_options;
  Highs highs;
  
  Highs::Highs(&highs);
  HighsCommandLineOptions::HighsCommandLineOptions(&cmd_options);
  HighsOptions::HighsOptions(&loaded_options);
  std::__cxx11::string::assign((char *)&loaded_options.super_HighsOptionsStruct.log_file);
  std::__cxx11::string::string((string *)&local_5b18,"",(allocator *)&usage_msg);
  std::__cxx11::string::string((string *)&local_5b38,"",(allocator *)local_5bb8);
  CLI::App::App(&app,&local_5b18,&local_5b38);
  std::__cxx11::string::~string((string *)&local_5b38);
  std::__cxx11::string::~string((string *)&local_5b18);
  setupCommandLineOptions(&app,&cmd_options);
  std::__cxx11::string::string((string *)&local_5b58,*argv,&local_5bd9);
  std::operator+(local_5bb8,"usage:\n      ",&local_5b58);
  std::operator+(&usage_msg,local_5bb8," [options] [file]");
  std::__cxx11::string::~string((string *)local_5bb8);
  std::__cxx11::string::~string((string *)&local_5b58);
  std::__cxx11::string::string(local_5af8,(string *)&usage_msg);
  std::__cxx11::string::operator=((string *)&app.usage_,local_5af8);
  std::__cxx11::string::~string(local_5af8);
  CLI::App::parse_char_t<char>(&app,argc,argv);
  report_log_options = &highs.options_.super_HighsOptionsStruct.log_options;
  std::__cxx11::string::~string((string *)&usage_msg);
  bVar1 = loadOptions(&app,report_log_options,&cmd_options,&loaded_options);
  iVar3 = -1;
  if (bVar1) {
    if (loaded_options.super_HighsOptionsStruct.output_flag == true) {
      Highs::openLogFile((string *)&highs);
    }
    Highs::passOptions((HighsOptions *)&highs);
    std::__cxx11::string::string((string *)&usage_msg,"",(allocator *)local_5bb8);
    Highs::writeOptions((string *)&highs,SUB81(&usage_msg,0));
    std::__cxx11::string::~string((string *)&usage_msg);
    iVar2 = Highs::readModel((string *)&highs);
    if (iVar2 == -1) {
      highsLogUser(report_log_options,kInfo,"Error loading file\n");
    }
    else {
      bVar1 = std::operator!=(&cmd_options.cmd_read_basis_file,"");
      if ((bVar1) && (iVar2 = Highs::readBasis((string *)&highs), iVar2 == -1)) {
        highsLogUser(report_log_options,kInfo,"Error reading basis from file\n");
      }
      else {
        bVar1 = std::operator!=(&cmd_options.read_solution_file,"");
        if ((bVar1) &&
           (iVar2 = Highs::readSolution((string *)&highs,(int)&cmd_options.read_solution_file),
           iVar2 == -1)) {
          highsLogUser(report_log_options,kInfo,"Error loading solution file\n");
        }
        else {
          if (highs.options_.super_HighsOptionsStruct.write_presolved_model_to_file == true) {
            iVar2 = Highs::presolve();
            if (iVar2 == -1) goto LAB_0010de35;
            if (((uint)highs.model_presolve_status_ < 6) &&
               ((0x39U >> (highs.model_presolve_status_ & 0x1f) & 1) != 0)) {
              iVar3 = Highs::writePresolvedModel((string *)&highs);
              goto LAB_0010de35;
            }
            highsLogUser(report_log_options,kInfo,"No presolved model to write to file\n");
          }
          else {
            iVar2 = Highs::run();
            if (iVar2 == -1) goto LAB_0010de35;
            bVar1 = std::operator!=(&cmd_options.cmd_write_basis_file,"");
            if ((bVar1) && (iVar4 = Highs::writeBasis((string *)&highs), iVar4 == -1)) {
              highsLogUser(report_log_options,kInfo,"Error writing basis to file\n");
              goto LAB_0010de35;
            }
            if ((highs.options_.super_HighsOptionsStruct.write_solution_to_file != false) ||
               (bVar1 = std::operator!=(&highs.options_.super_HighsOptionsStruct.solution_file,""),
               bVar1)) {
              Highs::writeSolution((string *)&highs,(int)&highs + 0xb38);
            }
            if ((highs.options_.super_HighsOptionsStruct.write_model_to_file == true) &&
               (iVar4 = Highs::writeModel((string *)&highs), iVar4 == -1)) goto LAB_0010de35;
          }
          iVar3 = iVar2;
        }
      }
    }
  }
LAB_0010de35:
  CLI::App::~App(&app);
  HighsOptions::~HighsOptions(&loaded_options);
  HighsCommandLineOptions::~HighsCommandLineOptions(&cmd_options);
  Highs::~Highs(&highs);
  return iVar3;
}

Assistant:

int main(int argc, char** argv) {
  // Create the Highs instance.
  Highs highs;
  const HighsOptions& options = highs.getOptions();
  const HighsLogOptions& log_options = options.log_options;

  // Load user options.
  HighsCommandLineOptions cmd_options;
  HighsOptions loaded_options;

  // Set "HiGHS.log" as the default log_file for the app so that
  // log_file has this value if it isn't set in the file
  loaded_options.log_file = "HiGHS.log";
  // When loading the options file, any messages are reported using
  // the default HighsLogOptions

  // Replace command line options parsing library
  // cxxopts now Cpp17 with
  // CLI11 for Cpp11

  CLI::App app{""};
  argv = app.ensure_utf8(argv);

  setupCommandLineOptions(app, cmd_options);

  try {
    std::string usage_msg =
        "usage:\n      " + std::string(argv[0]) + " [options] [file]";
    app.usage(usage_msg);

    app.parse(argc, argv);
  } catch (const CLI::CallForHelp& e) {
    std::cout << app.help() << std::endl;
    return 0;
  } catch (const CLI::CallForAllHelp& e) {
    std::cout << app.help();
    return 0;
  } catch (const CLI::RequiredError& e) {
    std::cout << "Please specify filename in .mps|.lp|.ems format."
              << std::endl;
    return (int)HighsStatus::kError;
  } catch (const CLI::ExtrasError& e) {
    std::cout << e.what() << std::endl;
    std::cout << "Multiple files not supported." << std::endl;
    return (int)HighsStatus::kError;
  } catch (const CLI::ArgumentMismatch& e) {
    std::cout << e.what() << std::endl;
    std::cout << "Too many arguments provided. Please provide only one."
              << std::endl;
    return (int)HighsStatus::kError;
  } catch (const CLI::ParseError& e) {
    std::cout << e.what() << std::endl;
    // app.exit() should be called from main.
    return app.exit(e);
  }

  if (!loadOptions(app, log_options, cmd_options, loaded_options))
    return (int)HighsStatus::kError;

  // Open the app log file - unless output_flag is false, to avoid
  // creating an empty file. It does nothing if its name is "".
  if (loaded_options.output_flag) highs.openLogFile(loaded_options.log_file);

  // Pass the option settings to HiGHS. Only error-checking produces
  // output, but values are checked in loadOptions, so it's safe to
  // call this first so that printHighsVersionCopyright uses reporting
  // settings defined in any options file.
  highs.passOptions(loaded_options);
  //  highs.writeOptions("Options.md");
  highs.writeOptions("", true);

  // Load the model from model_file
  HighsStatus read_status = highs.readModel(cmd_options.model_file);
  if (read_status == HighsStatus::kError) {
    highsLogUser(log_options, HighsLogType::kInfo, "Error loading file\n");
    return (int)read_status;
  }

  if (cmd_options.cmd_read_basis_file != "") {
    HighsStatus basis_status = highs.readBasis(cmd_options.cmd_read_basis_file);
    if (basis_status == HighsStatus::kError) {
      highsLogUser(log_options, HighsLogType::kInfo,
                   "Error reading basis from file\n");
      return (int)basis_status;
    }
  }

  // Possible read a solution file
  if (cmd_options.read_solution_file != "") {
    HighsStatus read_solution_status =
        highs.readSolution(cmd_options.read_solution_file);
    if (read_solution_status == HighsStatus::kError) {
      highsLogUser(log_options, HighsLogType::kInfo,
                   "Error loading solution file\n");
      return (int)read_solution_status;
    }
  }
  if (options.write_presolved_model_to_file) {
    // Run presolve and write the presolved model to a file
    HighsStatus status = highs.presolve();
    if (status == HighsStatus::kError) return int(status);
    HighsPresolveStatus model_presolve_status = highs.getModelPresolveStatus();
    const bool ok_to_write =
        model_presolve_status == HighsPresolveStatus::kNotReduced ||
        model_presolve_status == HighsPresolveStatus::kReduced ||
        model_presolve_status == HighsPresolveStatus::kReducedToEmpty ||
        model_presolve_status == HighsPresolveStatus::kTimeout;
    if (!ok_to_write) {
      highsLogUser(log_options, HighsLogType::kInfo,
                   "No presolved model to write to file\n");
      return int(status);
    }
    status = highs.writePresolvedModel(options.write_presolved_model_file);
    return int(status);
  }
  // Solve the model
  HighsStatus run_status = highs.run();
  if (run_status == HighsStatus::kError) return int(run_status);

  // highs.writeInfo("Info.md");

  if (cmd_options.cmd_write_basis_file != "") {
    HighsStatus basis_status =
        highs.writeBasis(cmd_options.cmd_write_basis_file);
    if (basis_status == HighsStatus::kError) {
      highsLogUser(log_options, HighsLogType::kInfo,
                   "Error writing basis to file\n");

      return (int)basis_status;
    }
  }

  // Possibly write the solution to a file
  if (options.write_solution_to_file || options.solution_file != "")
    highs.writeSolution(options.solution_file, options.write_solution_style);

  // Possibly write the model to a file
  if (options.write_model_to_file) {
    HighsStatus write_model_status = highs.writeModel(options.write_model_file);
    if (write_model_status == HighsStatus::kError)
      return (int)write_model_status;  // todo: change to write model error
  }

  // Shut down task executor: optional and wip
  // HighsTaskExecutor::shutdown(true);

  return (int)run_status;
}